

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warped_motion.c
# Opt level: O3

int av1_find_projection(int np,int *pts1,int *pts2,BLOCK_SIZE bsize,int mvy,int mvx,
                       WarpedMotionParams *wm_params,int mi_row,int mi_col)

{
  uint uVar1;
  byte bVar2;
  undefined7 in_register_00000009;
  long lVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar22;
  undefined1 auVar21 [16];
  uint uVar23;
  int iVar24;
  
  uVar11 = CONCAT71(in_register_00000009,bsize) & 0xffffffff;
  iVar12 = (block_size_high[uVar11] >> 1) - 1;
  iVar4 = (block_size_wide[uVar11] >> 1) - 1;
  uVar11 = 0;
  if (np < 1) {
    iVar16 = 0;
    iVar17 = 0;
    iVar18 = 0;
    iVar19 = 0;
    lVar8 = 0;
    lVar3 = 0;
  }
  else {
    iVar16 = 0;
    iVar17 = 0;
    iVar18 = 0;
    iVar19 = 0;
    uVar13 = 0;
    iVar10 = 0;
    iVar7 = 0;
    do {
      iVar20 = (int)*(undefined8 *)(pts2 + uVar13 * 2) - (mvx + iVar4 * 8);
      iVar22 = (int)((ulong)*(undefined8 *)(pts2 + uVar13 * 2) >> 0x20) - (mvy + iVar12 * 8);
      uVar23 = (int)*(undefined8 *)(pts1 + uVar13 * 2) + iVar4 * -8;
      iVar24 = (int)((ulong)*(undefined8 *)(pts1 + uVar13 * 2) >> 0x20) + iVar12 * -8;
      uVar15 = uVar23 - iVar20;
      uVar1 = -uVar15;
      if (0 < (int)uVar15) {
        uVar1 = uVar15;
      }
      if (uVar1 < 0x100) {
        uVar15 = iVar24 - iVar22;
        uVar1 = -uVar15;
        if (0 < (int)uVar15) {
          uVar1 = uVar15;
        }
        if (uVar1 < 0x100) {
          uVar11 = (ulong)(uint)((int)uVar11 + ((int)((uVar23 * 4 + 0x20) * uVar23 + 0x80) >> 4));
          iVar10 = iVar10 + ((int)(uVar23 * 4 * iVar24 + (uVar23 + iVar24) * 0x10 + 0x40) >> 4);
          iVar7 = iVar7 + ((iVar24 * 4 + 0x20) * iVar24 + 0x80 >> 4);
          auVar21._0_4_ = iVar20 * 4;
          auVar21._4_4_ = iVar22 * 4;
          auVar21._8_4_ = auVar21._0_4_;
          auVar21._12_4_ = auVar21._4_4_;
          iVar16 = iVar16 + ((iVar22 + iVar24) * 0x10 + auVar21._4_4_ * iVar24 + 0x80 >> 4);
          iVar17 = iVar17 + ((iVar20 + iVar24) * 0x10 + auVar21._0_4_ * iVar24 + 0x40 >> 4);
          iVar18 = iVar18 + ((int)((iVar22 + uVar23) * 0x10 + auVar21._4_4_ * uVar23 + 0x40) >> 4);
          iVar19 = iVar19 + ((int)((iVar20 + uVar23) * 0x10 +
                                   (int)((auVar21._8_8_ & 0xffffffff) * (ulong)uVar23) + 0x80) >> 4)
          ;
        }
      }
      uVar13 = uVar13 + 1;
    } while ((uint)np != uVar13);
    lVar3 = (long)(int)uVar11;
    uVar11 = (ulong)iVar7;
    lVar8 = (long)iVar10;
  }
  uVar13 = lVar3 * uVar11 - lVar8 * lVar8;
  if (uVar13 == 0) {
    return 1;
  }
  uVar6 = -uVar13;
  if (0 < (long)uVar13) {
    uVar6 = uVar13;
  }
  if (uVar6 >> 0x20 == 0) {
    uVar1 = 0x1f;
    if ((uint)uVar6 != 0) {
      for (; (uint)uVar6 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    lVar14 = (-1L << ((byte)uVar1 & 0x3f)) + uVar6;
    if (uVar1 < 9) {
      lVar14 = lVar14 << (8 - (byte)uVar1 & 0x3f);
      goto LAB_003b3652;
    }
  }
  else {
    uVar1 = 0x1f;
    uVar15 = (uint)(uVar6 >> 0x20);
    if (uVar15 != 0) {
      for (; uVar15 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar1 = uVar1 ^ 0x20;
    lVar14 = (-1L << ((byte)uVar1 & 0x3f)) + uVar6;
  }
  bVar2 = (char)uVar1 - 8;
  lVar14 = (long)(((ulong)(1L << (bVar2 & 0x3f)) >> 1) + lVar14) >> (bVar2 & 0x3f);
LAB_003b3652:
  uVar15 = -(uint)div_lut[lVar14];
  if (-1 < (long)uVar13) {
    uVar15 = (uint)div_lut[lVar14];
  }
  uVar23 = uVar15 << (2U - (char)uVar1 & 0x1f);
  bVar2 = 0;
  if (1 < (ushort)uVar1) {
    uVar23 = uVar15;
    bVar2 = (char)uVar1 - 2;
  }
  lVar14 = (long)(short)uVar23;
  lVar5 = (uVar11 * (long)iVar19 - lVar8 * iVar17) * lVar14;
  uVar13 = (ulong)(1L << (bVar2 & 0x3f)) >> 1;
  if (lVar5 < 0) {
    uVar6 = -((long)(uVar13 - lVar5) >> (bVar2 & 0x3f));
  }
  else {
    uVar6 = lVar5 + uVar13 >> (bVar2 & 0x3f);
  }
  uVar9 = 0x11fff;
  if ((long)uVar6 < 0x11fff) {
    uVar9 = uVar6;
  }
  iVar7 = 0xe001;
  if (0xe001 < (long)uVar9) {
    iVar7 = (int)uVar9;
  }
  wm_params->wmmat[2] = iVar7;
  lVar5 = (iVar17 * lVar3 + (long)iVar19 * -lVar8) * lVar14;
  if (lVar5 < 0) {
    uVar6 = -((long)(uVar13 - lVar5) >> (bVar2 & 0x3f));
  }
  else {
    uVar6 = lVar5 + uVar13 >> (bVar2 & 0x3f);
  }
  uVar9 = 0x1fff;
  if ((long)uVar6 < 0x1fff) {
    uVar9 = uVar6;
  }
  iVar17 = -0x1fff;
  if (-0x1fff < (long)uVar9) {
    iVar17 = (int)uVar9;
  }
  wm_params->wmmat[3] = iVar17;
  lVar5 = (uVar11 * (long)iVar18 - lVar8 * iVar16) * lVar14;
  if (lVar5 < 0) {
    uVar11 = -((long)(uVar13 - lVar5) >> (bVar2 & 0x3f));
  }
  else {
    uVar11 = lVar5 + uVar13 >> (bVar2 & 0x3f);
  }
  uVar6 = 0x1fff;
  if ((long)uVar11 < 0x1fff) {
    uVar6 = uVar11;
  }
  uVar11 = 0xffffffffffffe001;
  if (-0x1fff < (long)uVar6) {
    uVar11 = uVar6;
  }
  wm_params->wmmat[4] = (int)uVar11;
  lVar14 = (lVar3 * iVar16 + (long)iVar18 * -lVar8) * lVar14;
  if (lVar14 < 0) {
    uVar13 = -((long)(uVar13 - lVar14) >> (bVar2 & 0x3f));
  }
  else {
    uVar13 = lVar14 + uVar13 >> (bVar2 & 0x3f);
  }
  uVar6 = 0x11fff;
  if ((long)uVar13 < 0x11fff) {
    uVar6 = uVar13;
  }
  iVar16 = 0xe001;
  if (0xe001 < (long)uVar6) {
    iVar16 = (int)uVar6;
  }
  wm_params->wmmat[5] = iVar16;
  iVar12 = iVar12 + mi_row * 4;
  iVar4 = iVar4 + mi_col * 4;
  iVar17 = ((0x10000 - iVar7) * iVar4 + mvx * 0x2000) - iVar17 * iVar12;
  iVar12 = (0x10000 - iVar16) * iVar12 + (mvy * 0x2000 - (int)uVar11 * iVar4);
  if (0x7ffffe < iVar17) {
    iVar17 = 0x7fffff;
  }
  if (iVar17 < -0x7fffff) {
    iVar17 = -0x800000;
  }
  wm_params->wmmat[0] = iVar17;
  if (0x7ffffe < iVar12) {
    iVar12 = 0x7fffff;
  }
  if (iVar12 < -0x7fffff) {
    iVar12 = -0x800000;
  }
  wm_params->wmmat[1] = iVar12;
  uVar1 = av1_get_shear_params(wm_params);
  return uVar1 ^ 1;
}

Assistant:

static int find_affine_int(int np, const int *pts1, const int *pts2,
                           BLOCK_SIZE bsize, int mvy, int mvx,
                           WarpedMotionParams *wm, int mi_row, int mi_col) {
  int32_t A[2][2] = { { 0, 0 }, { 0, 0 } };
  int32_t Bx[2] = { 0, 0 };
  int32_t By[2] = { 0, 0 };

  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const int rsuy = bh / 2 - 1;
  const int rsux = bw / 2 - 1;
  const int suy = rsuy * 8;
  const int sux = rsux * 8;
  const int duy = suy + mvy;
  const int dux = sux + mvx;

  // Assume the center pixel of the block has exactly the same motion vector
  // as transmitted for the block. First shift the origin of the source
  // points to the block center, and the origin of the destination points to
  // the block center added to the motion vector transmitted.
  // Let (xi, yi) denote the source points and (xi', yi') denote destination
  // points after origin shfifting, for i = 0, 1, 2, .... n-1.
  // Then if  P = [x0, y0,
  //               x1, y1
  //               x2, y1,
  //                ....
  //              ]
  //          q = [x0', x1', x2', ... ]'
  //          r = [y0', y1', y2', ... ]'
  // the least squares problems that need to be solved are:
  //          [h1, h2]' = inv(P'P)P'q and
  //          [h3, h4]' = inv(P'P)P'r
  // where the affine transformation is given by:
  //          x' = h1.x + h2.y
  //          y' = h3.x + h4.y
  //
  // The loop below computes: A = P'P, Bx = P'q, By = P'r
  // We need to just compute inv(A).Bx and inv(A).By for the solutions.
  // Contribution from neighbor block
  for (int i = 0; i < np; i++) {
    const int dx = pts2[i * 2] - dux;
    const int dy = pts2[i * 2 + 1] - duy;
    const int sx = pts1[i * 2] - sux;
    const int sy = pts1[i * 2 + 1] - suy;
    // (TODO)yunqing: This comparison wouldn't be necessary if the sample
    // selection is done in find_samples(). Also, global offset can be removed
    // while collecting samples.
    if (abs(sx - dx) < LS_MV_MAX && abs(sy - dy) < LS_MV_MAX) {
      A[0][0] += LS_SQUARE(sx);
      A[0][1] += LS_PRODUCT1(sx, sy);
      A[1][1] += LS_SQUARE(sy);
      Bx[0] += LS_PRODUCT2(sx, dx);
      Bx[1] += LS_PRODUCT1(sy, dx);
      By[0] += LS_PRODUCT1(sx, dy);
      By[1] += LS_PRODUCT2(sy, dy);
    }
  }

  // Just for debugging, and can be removed later.
  assert(A[0][0] >= LS_MAT_MIN && A[0][0] <= LS_MAT_MAX);
  assert(A[0][1] >= LS_MAT_MIN && A[0][1] <= LS_MAT_MAX);
  assert(A[1][1] >= LS_MAT_MIN && A[1][1] <= LS_MAT_MAX);
  assert(Bx[0] >= LS_MAT_MIN && Bx[0] <= LS_MAT_MAX);
  assert(Bx[1] >= LS_MAT_MIN && Bx[1] <= LS_MAT_MAX);
  assert(By[0] >= LS_MAT_MIN && By[0] <= LS_MAT_MAX);
  assert(By[1] >= LS_MAT_MIN && By[1] <= LS_MAT_MAX);

  // Compute Determinant of A
  const int64_t Det = (int64_t)A[0][0] * A[1][1] - (int64_t)A[0][1] * A[0][1];
  if (Det == 0) return 1;

  int16_t shift;
  int16_t iDet = resolve_divisor_64(llabs(Det), &shift) * (Det < 0 ? -1 : 1);
  shift -= WARPEDMODEL_PREC_BITS;
  if (shift < 0) {
    iDet <<= (-shift);
    shift = 0;
  }

  int64_t Px[2], Py[2];
  // These divided by the Det, are the least squares solutions
  Px[0] = (int64_t)A[1][1] * Bx[0] - (int64_t)A[0][1] * Bx[1];
  Px[1] = -(int64_t)A[0][1] * Bx[0] + (int64_t)A[0][0] * Bx[1];
  Py[0] = (int64_t)A[1][1] * By[0] - (int64_t)A[0][1] * By[1];
  Py[1] = -(int64_t)A[0][1] * By[0] + (int64_t)A[0][0] * By[1];

  wm->wmmat[2] = get_mult_shift_diag(Px[0], iDet, shift);
  wm->wmmat[3] = get_mult_shift_ndiag(Px[1], iDet, shift);
  wm->wmmat[4] = get_mult_shift_ndiag(Py[0], iDet, shift);
  wm->wmmat[5] = get_mult_shift_diag(Py[1], iDet, shift);

  const int isuy = (mi_row * MI_SIZE + rsuy);
  const int isux = (mi_col * MI_SIZE + rsux);
  // Note: In the vx, vy expressions below, the max value of each of the
  // 2nd and 3rd terms are (2^16 - 1) * (2^13 - 1). That leaves enough room
  // for the first term so that the overall sum in the worst case fits
  // within 32 bits overall.
  const int32_t vx = mvx * (1 << (WARPEDMODEL_PREC_BITS - 3)) -
                     (isux * (wm->wmmat[2] - (1 << WARPEDMODEL_PREC_BITS)) +
                      isuy * wm->wmmat[3]);
  const int32_t vy = mvy * (1 << (WARPEDMODEL_PREC_BITS - 3)) -
                     (isux * wm->wmmat[4] +
                      isuy * (wm->wmmat[5] - (1 << WARPEDMODEL_PREC_BITS)));
  wm->wmmat[0] =
      clamp(vx, -WARPEDMODEL_TRANS_CLAMP, WARPEDMODEL_TRANS_CLAMP - 1);
  wm->wmmat[1] =
      clamp(vy, -WARPEDMODEL_TRANS_CLAMP, WARPEDMODEL_TRANS_CLAMP - 1);
  return 0;
}